

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btMultiBodyDynamicsWorld::updateActivationState(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  btMultiBody *this_00;
  btCollisionObject *pbVar1;
  undefined4 in_EAX;
  int b;
  long lVar2;
  int i;
  long lVar3;
  int b_1;
  long lVar4;
  CProfileSample __profile;
  undefined8 uStack_38;
  btScalar bStack_34;
  
  uStack_38 = CONCAT44(timeStep,in_EAX);
  CProfileManager::Start_Profile("btMultiBodyDynamicsWorld::updateActivationState");
  for (lVar3 = 0; lVar3 < (this->m_multiBodies).m_size; lVar3 = lVar3 + 1) {
    this_00 = (this->m_multiBodies).m_data[lVar3];
    if (this_00 != (btMultiBody *)0x0) {
      btMultiBody::checkMotionAndSleepIfRequired(this_00,bStack_34);
      pbVar1 = (btCollisionObject *)this_00->m_baseCollider;
      if (this_00->m_awake == false) {
        if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 == 1)) {
          btCollisionObject::setActivationState(pbVar1,3);
          pbVar1->m_deactivationTime = 0.0;
        }
        lVar2 = 0x1e8;
        for (lVar4 = 0; lVar4 < (this_00->m_links).m_size; lVar4 = lVar4 + 1) {
          pbVar1 = *(btCollisionObject **)
                    ((long)(((this_00->m_links).m_data)->m_inertiaLocal).m_floats + lVar2 + -4);
          if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 == 1)) {
            btCollisionObject::setActivationState(pbVar1,3);
            pbVar1->m_deactivationTime = 0.0;
          }
          lVar2 = lVar2 + 600;
        }
      }
      else {
        if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 != 4)) {
          btCollisionObject::setActivationState(pbVar1,1);
        }
        lVar4 = 0x1e8;
        for (lVar2 = 0; lVar2 < (this_00->m_links).m_size; lVar2 = lVar2 + 1) {
          pbVar1 = *(btCollisionObject **)
                    ((long)(((this_00->m_links).m_data)->m_inertiaLocal).m_floats + lVar4 + -4);
          if ((pbVar1 != (btCollisionObject *)0x0) && (pbVar1->m_activationState1 != 4)) {
            btCollisionObject::setActivationState(pbVar1,1);
          }
          lVar4 = lVar4 + 600;
        }
      }
    }
  }
  btDiscreteDynamicsWorld::updateActivationState(&this->super_btDiscreteDynamicsWorld,bStack_34);
  CProfileSample::~CProfileSample(&__profile);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::updateActivationState(btScalar timeStep)
{
	BT_PROFILE("btMultiBodyDynamicsWorld::updateActivationState");

	
	
	for ( int i=0;i<m_multiBodies.size();i++)
	{
		btMultiBody* body = m_multiBodies[i];
		if (body)
		{
			body->checkMotionAndSleepIfRequired(timeStep);
			if (!body->isAwake())
			{
				btMultiBodyLinkCollider* col = body->getBaseCollider();
				if (col && col->getActivationState() == ACTIVE_TAG)
				{
					col->setActivationState( WANTS_DEACTIVATION);
					col->setDeactivationTime(0.f);
				}
				for (int b=0;b<body->getNumLinks();b++)
				{
					btMultiBodyLinkCollider* col = body->getLink(b).m_collider;
					if (col && col->getActivationState() == ACTIVE_TAG)
					{
						col->setActivationState( WANTS_DEACTIVATION);
						col->setDeactivationTime(0.f);
					}
				}
			} else
			{
				btMultiBodyLinkCollider* col = body->getBaseCollider();
				if (col && col->getActivationState() != DISABLE_DEACTIVATION)
					col->setActivationState( ACTIVE_TAG );

				for (int b=0;b<body->getNumLinks();b++)
				{
					btMultiBodyLinkCollider* col = body->getLink(b).m_collider;
					if (col && col->getActivationState() != DISABLE_DEACTIVATION)
						col->setActivationState( ACTIVE_TAG );
				}
			}

		}
	}

	btDiscreteDynamicsWorld::updateActivationState(timeStep);
}